

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-wear.c
# Opt level: O0

uint16_t borg_best_stuff_order(int n)

{
  uint16_t local_a;
  int n_local;
  
  switch(n) {
  case 0:
    local_a = z_info->pack_size + 1;
    break;
  case 1:
    local_a = z_info->pack_size;
    break;
  case 2:
    local_a = z_info->pack_size + 6;
    break;
  case 3:
    local_a = z_info->pack_size + 7;
    break;
  case 4:
    local_a = z_info->pack_size + 8;
    break;
  case 5:
    local_a = z_info->pack_size + 9;
    break;
  case 6:
    local_a = z_info->pack_size + 10;
    break;
  case 7:
    local_a = z_info->pack_size + 0xb;
    break;
  case 8:
    local_a = z_info->pack_size + 3;
    break;
  case 9:
    local_a = z_info->pack_size + 2;
    break;
  case 10:
    local_a = z_info->pack_size + 5;
    break;
  case 0xb:
    local_a = z_info->pack_size + 4;
    break;
  default:
    local_a = 0xff;
  }
  return local_a;
}

Assistant:

static uint16_t borg_best_stuff_order(int n)
{
    switch (n) {
    case 0:
        return INVEN_BOW;
    case 1:
        return INVEN_WIELD;
    case 2:
        return INVEN_BODY;
    case 3:
        return INVEN_OUTER;
    case 4:
        return INVEN_ARM;
    case 5:
        return INVEN_HEAD;
    case 6:
        return INVEN_HANDS;
    case 7:
        return INVEN_FEET;
    case 8:
        return INVEN_LEFT;
    case 9:
        return INVEN_RIGHT;
    case 10:
        return INVEN_LIGHT;
    case 11:
        return INVEN_NECK;
    default:
        return 255;
    }
}